

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O3

t_GSA __thiscall egsa_stream::read_el(egsa_stream *this)

{
  ostream *poVar1;
  ifstream *piVar2;
  ulong unaff_RBP;
  ulong unaff_R12;
  uint *puVar3;
  ulong unaff_R15;
  t_GSA tVar4;
  uint8_t x8;
  uint8_t x8_7;
  uint8_t x8_6;
  uint8_t x8_5;
  uint8_t x8_3;
  uint8_t x8_2;
  uint8_t x8_1;
  uint16_t x16_5;
  uint16_t x16_4;
  uint16_t x16_3;
  uint16_t x16_2;
  uint16_t x16_1;
  uint16_t x16;
  uint32_t x32_5;
  uint32_t x32_4;
  uint32_t x32_3;
  uint32_t x32_2;
  uint32_t x32_1;
  uint32_t x32;
  uint local_60 [3];
  byte local_52;
  byte local_51;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  if (this->egsa != true) {
    if (this->bcr != true) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Error: missing index files.");
      std::endl<char,std::char_traits<char>>(poVar1);
      exit(1);
    }
    switch(this->suff_size) {
    case 1:
      std::istream::read((char *)&this->GSA,(long)&local_50);
      unaff_R15 = (ulong)local_50;
      break;
    case 2:
      std::istream::read((char *)&this->GSA,(long)&local_48);
      unaff_R15 = (ulong)local_48;
      break;
    case 4:
      puVar3 = &local_38;
      goto LAB_0010a396;
    case 8:
      puVar3 = local_60;
LAB_0010a396:
      std::istream::read((char *)&this->GSA,(long)puVar3);
      unaff_R15 = (ulong)*puVar3;
    }
    switch(this->da_size) {
    case 1:
      std::istream::read((char *)&this->GSA,(long)&local_51);
      unaff_RBP = (ulong)local_51;
      break;
    case 2:
      std::istream::read((char *)&this->GSA,(long)&local_4a);
      unaff_RBP = (ulong)local_4a;
      break;
    case 4:
      puVar3 = &local_3c;
      goto LAB_0010a41d;
    case 8:
      puVar3 = local_60;
LAB_0010a41d:
      std::istream::read((char *)&this->GSA,(long)puVar3);
      unaff_RBP = (ulong)*puVar3;
    }
    switch(this->lcp_size) {
    case 1:
      std::istream::read((char *)&this->LCP,(long)&local_52);
      unaff_R12 = (ulong)local_52;
      break;
    case 2:
      std::istream::read((char *)&this->LCP,(long)&local_4c);
      unaff_R12 = (ulong)local_4c;
      break;
    case 4:
      puVar3 = &local_40;
      goto LAB_0010a4a4;
    case 8:
      puVar3 = local_60;
LAB_0010a4a4:
      std::istream::read((char *)&this->LCP,(long)puVar3);
      unaff_R12 = (ulong)*puVar3;
    }
    piVar2 = &this->BWT;
    goto LAB_0010a4b6;
  }
  switch(this->da_size) {
  case 1:
    std::istream::read((char *)&this->EGSA,(long)&local_4d);
    unaff_RBP = (ulong)local_4d;
    break;
  case 2:
    std::istream::read((char *)&this->EGSA,(long)&local_42);
    unaff_RBP = (ulong)local_42;
    break;
  case 4:
    puVar3 = &local_2c;
    goto LAB_0010a249;
  case 8:
    puVar3 = local_60;
LAB_0010a249:
    std::istream::read((char *)&this->EGSA,(long)puVar3);
    unaff_RBP = (ulong)*puVar3;
  }
  switch(this->suff_size) {
  case 1:
    std::istream::read((char *)&this->EGSA,(long)&local_4e);
    unaff_R15 = (ulong)local_4e;
    break;
  case 2:
    std::istream::read((char *)&this->EGSA,(long)&local_44);
    unaff_R15 = (ulong)local_44;
    break;
  case 4:
    puVar3 = &local_30;
    goto LAB_0010a2c4;
  case 8:
    puVar3 = local_60;
LAB_0010a2c4:
    std::istream::read((char *)&this->EGSA,(long)puVar3);
    unaff_R15 = (ulong)*puVar3;
  }
  switch(this->lcp_size) {
  case 1:
    std::istream::read((char *)&this->EGSA,(long)&local_4f);
    unaff_R12 = (ulong)local_4f;
    break;
  case 2:
    std::istream::read((char *)&this->EGSA,(long)&local_46);
    unaff_R12 = (ulong)local_46;
    break;
  case 4:
    puVar3 = &local_34;
    goto LAB_0010a33f;
  case 8:
    puVar3 = local_60;
LAB_0010a33f:
    std::istream::read((char *)&this->EGSA,(long)puVar3);
    unaff_R12 = (ulong)*puVar3;
  }
  piVar2 = &this->EGSA;
LAB_0010a4b6:
  std::istream::read((char *)piVar2,(long)local_60);
  tVar4._0_8_ = unaff_RBP & 0xffffffff | unaff_R15 << 0x20;
  tVar4._8_8_ = unaff_R12 & 0xffffffff | (ulong)(byte)local_60[0] << 0x20;
  return tVar4;
}

Assistant:

t_GSA read_el(){

		t_GSA e;

		if(egsa){

			switch(da_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.text = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.text = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.text = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.text = x64; break;

			}

			switch(suff_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.suff = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.suff = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.suff = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.suff = x64; break;

			}

			switch(lcp_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.lcp = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.lcp = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.lcp = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.lcp = x64; break;

			}

			uint8_t x8;
			EGSA.read((char*)&x8, 1);
			e.bwt = x8;

		}else if(bcr){

			switch(suff_size){

				case 1 : uint8_t x8; GSA.read((char*)&x8, 1); e.suff = x8;  break;
				case 2 : uint16_t x16; GSA.read((char*)&x16, 2); e.suff = x16; break;
				case 4 : uint32_t x32; GSA.read((char*)&x32, 4); e.suff = x32; break;
				case 8 : uint64_t x64; GSA.read((char*)&x64, 8); e.suff = x64; break;

			}

			switch(da_size){

				case 1 : uint8_t x8; GSA.read((char*)&x8, 1); e.text = x8;  break;
				case 2 : uint16_t x16; GSA.read((char*)&x16, 2); e.text = x16; break;
				case 4 : uint32_t x32; GSA.read((char*)&x32, 4); e.text = x32; break;
				case 8 : uint64_t x64; GSA.read((char*)&x64, 8); e.text = x64; break;

			}

			switch(lcp_size){

				case 1 : uint8_t x8; LCP.read((char*)&x8, 1); e.lcp = x8;  break;
				case 2 : uint16_t x16; LCP.read((char*)&x16, 2); e.lcp = x16; break;
				case 4 : uint32_t x32; LCP.read((char*)&x32, 4); e.lcp = x32; break;
				case 8 : uint64_t x64; LCP.read((char*)&x64, 8); e.lcp = x64; break;

			}

			uint8_t x8;
			BWT.read((char*)&x8, 1);
			e.bwt = x8;

		}else{

			cout << "Error: missing index files." << endl;
			exit(1);

		}

		return e;

	}